

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O3

void __thiscall embree::FastAllocator::reset(FastAllocator *this)

{
  ulong uVar1;
  Block *pBVar2;
  __pointer_type pBVar3;
  pointer ppTVar4;
  __pointer_type pBVar5;
  __pointer_type pBVar6;
  long lVar7;
  Block **ppBVar8;
  ulong uVar9;
  pointer ppTVar10;
  __pointer_type local_20;
  
  internal_fix_used_blocks(this);
  LOCK();
  (this->bytesUsed).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->bytesFree).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->bytesWasted).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  while ((this->usedBlocks)._M_b._M_p != (__pointer_type)0x0) {
    pBVar6 = (this->usedBlocks)._M_b._M_p;
    uVar1 = (pBVar6->allocEnd).super___atomic_base<unsigned_long>._M_i;
    uVar9 = (pBVar6->cur).super___atomic_base<unsigned_long>._M_i;
    if (uVar9 < uVar1) {
      uVar9 = uVar1;
    }
    LOCK();
    (pBVar6->allocEnd).super___atomic_base<unsigned_long>._M_i = uVar9;
    UNLOCK();
    LOCK();
    (pBVar6->cur).super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    pBVar2 = ((this->usedBlocks)._M_b._M_p)->next;
    ((this->usedBlocks)._M_b._M_p)->next = (this->freeBlocks)._M_b._M_p;
    LOCK();
    (this->freeBlocks)._M_b._M_p = (this->usedBlocks)._M_b._M_p;
    UNLOCK();
    LOCK();
    (this->usedBlocks)._M_b._M_p = pBVar2;
    UNLOCK();
  }
  local_20 = (this->freeBlocks)._M_b._M_p;
  if (local_20 == (__pointer_type)0x0) {
    pBVar6 = (__pointer_type)0x0;
  }
  else {
    ppBVar8 = &local_20;
    pBVar5 = local_20;
    do {
      pBVar3 = pBVar5->next;
      if (pBVar5->atype == SHARED) {
        *ppBVar8 = pBVar3;
      }
      else {
        ppBVar8 = &pBVar5->next;
      }
      pBVar6 = local_20;
      pBVar5 = pBVar3;
    } while (pBVar3 != (__pointer_type)0x0);
  }
  LOCK();
  (this->freeBlocks)._M_b._M_p = pBVar6;
  UNLOCK();
  lVar7 = 0x17;
  do {
    LOCK();
    *(undefined8 *)((long)this + lVar7 * 8 + -0x40) = 0;
    UNLOCK();
    LOCK();
    this->threadUsedBlocks[lVar7 + -0xf]._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x1f);
  ppTVar10 = (this->thread_local_allocators).
             super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppTVar4 = (this->thread_local_allocators).
            super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar10 != ppTVar4) {
    do {
      ThreadLocal2::unbind(*ppTVar10,this);
      ppTVar10 = ppTVar10 + 1;
    } while (ppTVar10 != ppTVar4);
    ppTVar10 = (this->thread_local_allocators).
               super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((this->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppTVar10) {
      (this->thread_local_allocators).
      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppTVar10;
    }
  }
  return;
}

Assistant:

void reset ()
    {
      internal_fix_used_blocks();

      bytesUsed.store(0);
      bytesFree.store(0);
      bytesWasted.store(0);

      /* reset all used blocks and move them to begin of free block list */
      while (usedBlocks.load() != nullptr) {
        usedBlocks.load()->reset_block();
        Block* nextUsedBlock = usedBlocks.load()->next;
        usedBlocks.load()->next = freeBlocks.load();
        freeBlocks = usedBlocks.load();
        usedBlocks = nextUsedBlock;
      }

      /* remove all shared blocks as they are re-added during build */
      freeBlocks.store(Block::remove_shared_blocks(freeBlocks.load()));

      for (size_t i=0; i<MAX_THREAD_USED_BLOCK_SLOTS; i++)
      {
        threadUsedBlocks[i] = nullptr;
        threadBlocks[i] = nullptr;
      }
      
      /* unbind all thread local allocators */
      for (auto alloc : thread_local_allocators) alloc->unbind(this);
      thread_local_allocators.clear();
    }